

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMan.c
# Opt level: O0

Amap_Man_t * Amap_ManStart(int nNodes)

{
  Amap_Man_t *__s;
  Vec_Ptr_t *pVVar1;
  Vec_Int_t *pVVar2;
  Aig_MmFixed_t *pAVar3;
  Aig_MmFlex_t *pAVar4;
  Amap_Man_t *p;
  int nNodes_local;
  
  __s = (Amap_Man_t *)malloc(0xd8);
  memset(__s,0,0xd8);
  __s->fEpsilonInternal = 0.01;
  pVVar1 = Vec_PtrAlloc(100);
  __s->vPis = pVVar1;
  pVVar1 = Vec_PtrAlloc(100);
  __s->vPos = pVVar1;
  pVVar1 = Vec_PtrAlloc(100);
  __s->vObjs = pVVar1;
  pVVar2 = Vec_IntAlloc(100);
  __s->vTemp = pVVar2;
  pVVar1 = Vec_PtrAlloc(100);
  __s->vCuts0 = pVVar1;
  pVVar1 = Vec_PtrAlloc(100);
  __s->vCuts1 = pVVar1;
  pVVar1 = Vec_PtrAlloc(100);
  __s->vCuts2 = pVVar1;
  pVVar1 = Vec_PtrAlloc(100);
  __s->vTempP = pVVar1;
  pAVar3 = Aig_MmFixedStart(0x60,nNodes);
  __s->pMemObj = pAVar3;
  pAVar4 = Aig_MmFlexStart();
  __s->pMemCuts = pAVar4;
  pAVar4 = Aig_MmFlexStart();
  __s->pMemCutBest = pAVar4;
  pAVar4 = Aig_MmFlexStart();
  __s->pMemTemp = pAVar4;
  return __s;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts the AIG manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Amap_Man_t * Amap_ManStart( int nNodes )
{
    Amap_Man_t * p;
    // start the manager
    p = ABC_ALLOC( Amap_Man_t, 1 );
    memset( p, 0, sizeof(Amap_Man_t) );
    p->fEpsilonInternal = (float)0.01;
    // allocate arrays for nodes
    p->vPis    = Vec_PtrAlloc( 100 );
    p->vPos    = Vec_PtrAlloc( 100 );
    p->vObjs   = Vec_PtrAlloc( 100 );
    p->vTemp   = Vec_IntAlloc( 100 );
    p->vCuts0  = Vec_PtrAlloc( 100 );
    p->vCuts1  = Vec_PtrAlloc( 100 );
    p->vCuts2  = Vec_PtrAlloc( 100 );
    p->vTempP  = Vec_PtrAlloc( 100 );
    // prepare the memory manager
    p->pMemObj = Aig_MmFixedStart( sizeof(Amap_Obj_t), nNodes );
    p->pMemCuts = Aig_MmFlexStart();
    p->pMemCutBest = Aig_MmFlexStart();
    p->pMemTemp = Aig_MmFlexStart();
    return p;
}